

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Return * __thiscall Parser::return_stmt(Parser *this)

{
  bool bVar1;
  Token *pTVar2;
  Expr *pEVar3;
  pointer pRVar4;
  bool bVar5;
  bool err;
  __single_object r;
  Parser *this_local;
  
  r._M_t.super___uniq_ptr_impl<Return,_std::default_delete<Return>_>._M_t.
  super__Tuple_impl<0UL,_Return_*,_std::default_delete<Return>_>.
  super__Head_base<0UL,_Return_*,_false>._M_head_impl =
       (__uniq_ptr_data<Return,_std::default_delete<Return>,_true,_true>)
       (__uniq_ptr_data<Return,_std::default_delete<Return>,_true,_true>)this;
  std::make_unique<Return>();
  bVar5 = false;
  pTVar2 = next_token(this);
  if (pTVar2->kind == Eof) {
    bVar5 = true;
  }
  else {
    bVar1 = is_punctuator(this,';');
    if (!bVar1) {
      pEVar3 = expression(this);
      pRVar4 = std::unique_ptr<Return,_std::default_delete<Return>_>::operator->
                         ((unique_ptr<Return,_std::default_delete<Return>_> *)
                          &stack0xffffffffffffffe8);
      pRVar4->expr = pEVar3;
      pRVar4 = std::unique_ptr<Return,_std::default_delete<Return>_>::operator->
                         ((unique_ptr<Return,_std::default_delete<Return>_> *)
                          &stack0xffffffffffffffe8);
      bVar5 = pRVar4->expr == (Expr *)0x0;
    }
    bVar1 = is_punctuator(this,';');
    if (bVar1) {
      next_token(this);
    }
  }
  if (bVar5) {
    error<char_const(&)[49]>
              (this,(char (*) [49])"expecting \';\' or expression for return statement");
  }
  pRVar4 = std::unique_ptr<Return,_std::default_delete<Return>_>::release
                     ((unique_ptr<Return,_std::default_delete<Return>_> *)&stack0xffffffffffffffe8);
  std::unique_ptr<Return,_std::default_delete<Return>_>::~unique_ptr
            ((unique_ptr<Return,_std::default_delete<Return>_> *)&stack0xffffffffffffffe8);
  return pRVar4;
}

Assistant:

Return* Parser::return_stmt()
{
  auto r = std::make_unique<Return>();
  bool err = false;

  if (next_token().kind != TokenKind::Eof) {
    if (!is_punctuator(';')) {
      r->expr = expression();
      if (!r->expr)
        err = true;
    }
    if (is_punctuator(';')) {
      next_token(); // Skip ';', return with expression
    }
  }
  else
    err = true;

  if (err)
    error("expecting ';' or expression for return statement");

  return r.release();
}